

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTrans.c
# Opt level: O3

Aig_Man_t *
Saig_ManTimeframeSimplify(Aig_Man_t *pAig,int nFrames,int nFramesMax,int fInit,int fVerbose)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Man_t *pAVar4;
  Aig_Man_t *pAVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  timespec ts;
  timespec local_48;
  int local_38;
  int local_34;
  
  local_38 = fInit;
  local_34 = fVerbose;
  pAVar3 = Saig_ManFramesNonInitial(pAig,nFrames);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar4 = Fra_FraigEquivence(pAVar3,1000,0);
  if (local_34 != 0) {
    Aig_ManPrintStats(pAVar3);
    pAVar5 = pAVar4;
    Aig_ManPrintStats(pAVar4);
    Abc_Print((int)pAVar5,"%s =","Fraiging");
    iVar8 = 3;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  }
  Aig_ManStop(pAVar4);
  if (pAVar3->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pFrames->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                  ,0x18c,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  Saig_ManCreateMapping(pAig,pAVar3,nFrames);
  Aig_ManStop(pAVar3);
  pvVar1 = pAig->pData;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("p->pData != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                  ,0x41,"void Saig_ManStopMap1(Aig_Man_t *)");
  }
  if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 8));
  }
  free(pvVar1);
  pAig->pData = (void *)0x0;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar3 = pAig;
  pAVar4 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,local_38);
  Abc_Print((int)pAVar3,"%s =","Mapped");
  iVar8 = 3;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  pvVar1 = pAig->pData2;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 8));
    }
    free(pvVar1);
    pAig->pData2 = (void *)0x0;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
    }
    pAVar3 = pAig;
    pAVar5 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,local_38);
    Abc_Print((int)pAVar3,"%s =","Normal");
    iVar8 = 3;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
    if (local_34 != 0) {
      Aig_ManPrintStats(pAVar5);
      Aig_ManPrintStats(pAVar4);
    }
    Aig_ManStop(pAVar5);
    if (pAig->pData == (void *)0x0) {
      if (pAig->pData2 == (void *)0x0) {
        return pAVar4;
      }
      __assert_fail("!Saig_ManHasMap2(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                    ,0x1a2,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
    }
    __assert_fail("!Saig_ManHasMap1(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                  ,0x1a1,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  __assert_fail("p->pData2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTrans.c"
                ,0x70,"void Saig_ManStopMap2(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Saig_ManTimeframeSimplify( Aig_Man_t * pAig, int nFrames, int nFramesMax, int fInit, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigEquivence( Aig_Man_t * pManAig, int nConfMax, int fProve );
    Aig_Man_t * pFrames, * pFraig, * pRes1, * pRes2;
    abctime clk;
    // create uninitialized timeframes with map1
    pFrames = Saig_ManFramesNonInitial( pAig, nFrames );
    // perform fraiging for the unrolled timeframes
clk = Abc_Clock();
    pFraig = Fra_FraigEquivence( pFrames, 1000, 0 );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pFrames );
        Aig_ManPrintStats( pFraig );
ABC_PRT( "Fraiging", Abc_Clock() - clk );
    }
    Aig_ManStop( pFraig );
    assert( pFrames->pReprs != NULL );
    // create AIG with map2
    Saig_ManCreateMapping( pAig, pFrames, nFrames );
    Aig_ManStop( pFrames );
    Saig_ManStopMap1( pAig );
    // create reduced initialized timeframes
clk = Abc_Clock();
    pRes2 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Mapped", Abc_Clock() - clk );
    // free mapping
    Saig_ManStopMap2( pAig );
clk = Abc_Clock();
    pRes1 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Normal", Abc_Clock() - clk );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pRes1 );
        Aig_ManPrintStats( pRes2 );
    }
    Aig_ManStop( pRes1 );
    assert( !Saig_ManHasMap1(pAig) );
    assert( !Saig_ManHasMap2(pAig) );
    return pRes2;
}